

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O0

uint64 __thiscall crnlib::data_stream::skip(data_stream *this,uint64 len)

{
  uint uVar1;
  unsigned_long_long uVar2;
  ulong uVar3;
  uint64 bytes_read;
  uint64 bytes_to_read;
  uint8 buf [1024];
  uint64 uStack_20;
  uint cBufSize;
  uint64 total_bytes_read;
  uint64 len_local;
  data_stream *this_local;
  
  uStack_20 = 0;
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\x04';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  total_bytes_read = len;
  while( true ) {
    if (total_bytes_read == 0) {
      return uStack_20;
    }
    uVar2 = math::minimum<unsigned_long_long>(0x400,total_bytes_read);
    uVar1 = (*this->_vptr_data_stream[4])(this,&bytes_to_read,uVar2 & 0xffffffff);
    uVar3 = (ulong)uVar1;
    uStack_20 = uVar3 + uStack_20;
    if (uVar3 != uVar2) break;
    total_bytes_read = total_bytes_read - uVar3;
  }
  return uStack_20;
}

Assistant:

uint64 data_stream::skip(uint64 len) {
  uint64 total_bytes_read = 0;

  const uint cBufSize = 1024;
  uint8 buf[cBufSize];

  while (len) {
    const uint64 bytes_to_read = math::minimum<uint64>(sizeof(buf), len);
    const uint64 bytes_read = read(buf, static_cast<uint>(bytes_to_read));
    total_bytes_read += bytes_read;

    if (bytes_read != bytes_to_read)
      break;

    len -= bytes_read;
  }

  return total_bytes_read;
}